

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O1

bool __thiscall
helics::NetworkCore<helics::ipc::IpcComms,_(gmlc::networking::InterfaceTypes)3>::brokerConnect
          (NetworkCore<helics::ipc::IpcComms,_(gmlc::networking::InterfaceTypes)3> *this)

{
  bool bVar1;
  bool bVar2;
  IpcComms *this_00;
  int iVar3;
  string *commName;
  socklen_t __len;
  char *in_RCX;
  sockaddr *__addr;
  milliseconds timeOut;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->dataMutex);
  if (iVar3 == 0) {
    if ((this->netInfo).brokerAddress._M_string_length == 0) {
      in_RCX = "_ipc_broker";
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->netInfo).brokerAddress,0,0,"_ipc_broker",0xb);
    }
    CommsInterface::setRequireBrokerConnection
              (&((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).comms._M_t.
                 super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
                 .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl)->
                super_CommsInterface,true);
    bVar1 = (this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).super_CommonCore.
            super_BrokerBase.observer;
    bVar2 = (this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).super_CommonCore.
            super_BrokerBase.useJsonSerialization;
    __len = (socklen_t)CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
    (this->netInfo).useJsonSerialization = bVar2;
    (this->netInfo).observer = bVar1;
    this_00 = (this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).comms._M_t.
              super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
              .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl;
    commName = CommonCore::getIdentifier_abi_cxx11_((CommonCore *)this);
    CommsInterface::setName(&this_00->super_CommsInterface,commName);
    ipc::IpcComms::loadNetworkInfo
              ((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).comms._M_t.
               super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
               .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl,&this->netInfo);
    timeOut.__r = (this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).
                  super_CommonCore.super_BrokerBase.networkTimeout.internalTimeCode / 1000000;
    CommsInterface::setTimeout
              (&((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).comms._M_t.
                 super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
                 .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl)->
                super_CommsInterface,timeOut);
    iVar3 = CommsInterface::connect
                      (&((this->super_CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>).comms.
                         _M_t.
                         super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
                         .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl)->
                        super_CommsInterface,(int)timeOut.__r,__addr,__len);
    if ((SUB41(iVar3,0) != false) && ((this->netInfo).portNumber < 0)) {
      (this->netInfo).portNumber = -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->dataMutex);
    return SUB41(iVar3,0);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool NetworkCore<COMMS, baseline>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if (netInfo.brokerAddress.empty())  // cores require a broker
    {
        netInfo.brokerAddress = defBrokerInterface[static_cast<int>(baseline)];
    }
    CommsBroker<COMMS, CommonCore>::comms->setRequireBrokerConnection(true);
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CommonCore>::comms->setName(CommonCore::getIdentifier());
    CommsBroker<COMMS, CommonCore>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CommonCore>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());
    auto res = CommsBroker<COMMS, CommonCore>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CommonCore>::comms->getPort();
        }
    }
    return res;
}